

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O3

void __thiscall
MyP2PClientConnection::OnData
          (MyP2PClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  uint32_t uVar2;
  uint3 uVar3;
  OutputWorker *pOVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  undefined1 local_1b8 [392];
  
  if (bytes != 0) {
    if (*data == '\b') {
      if ((int)Logger.ChannelMinLevel < 5 && channel != 0x98) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong channel",0x1d);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      if ((bytes != 0x578) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong size",0x1a);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      uVar3 = *(uint3 *)(data + 3);
      uVar5 = tonk::SDKConnection::FromLocalTime16
                        (&this->super_SDKConnection,*(uint16_t *)(data + 1));
      uVar6 = tonk::SDKConnection::FromLocalTime23(&this->super_SDKConnection,(uint)uVar3);
      if ((int)Logger.ChannelMinLevel < 5 && *(int3 *)(data + 6) != -0x522ed3) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Bad magic",0x19);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      uVar2 = *(uint32_t *)(data + 9);
      if ((this->NextPacketIndex != uVar2) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Incorrect packet id",0x23);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      this->NextPacketIndex = uVar2 + 1;
      tonk::SDKConnection::GetStatus((TonkStatus *)local_1b8,&this->super_SDKConnection);
      if ((local_1b8._0_8_ & 1) != 0) {
        uVar7 = tonk_time();
        test::OWDTimeStatistics::AddSample(&this->OWDStats,uVar7 - uVar6);
        if (1999999 < uVar7 - this->LastStatsUsec) {
          this->LastStatsUsec = uVar7;
          if ((int)Logger.ChannelMinLevel < 3) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            local_1b8._0_8_ = Logger.ChannelName;
            local_1b8._8_4_ = Info;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,
                       Logger.Prefix._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"DATA RESULT: Transmission time (acc=16) = ",0x2a);
            std::ostream::operator<<((ostream *)poVar1,(int)uVar7 - (int)uVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", (acc=23) = ",0xd);
            std::ostream::operator<<((ostream *)poVar1,(int)(uVar7 - uVar6));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," # ",3);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            pOVar4 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
          }
          test::OWDTimeStatistics::PrintStatistics(&this->OWDStats);
        }
      }
    }
    else if (*data == '\a') {
      if ((int)Logger.ChannelMinLevel < 5 && channel != 0x98) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong channel",0x1d);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      if ((int)Logger.ChannelMinLevel < 5 && bytes != 0x578) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong size",0x1a);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      if ((int)Logger.ChannelMinLevel < 5 && *(int3 *)(data + 6) != -0x522ed3) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Bad magic",0x19);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      uVar2 = *(uint32_t *)(data + 9);
      if ((this->NextPacketIndex != uVar2) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Incorrect packet id",0x23);
        pOVar4 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      this->NextPacketIndex = uVar2 + 1;
    }
    else if ((int)Logger.ChannelMinLevel < 5) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Peer: Got ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," bytes of message data",0x16);
      pOVar4 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar4,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  return;
}

Assistant:

void MyP2PClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (bytes <= 0)
        return;

    if (bytes > 0)
    {
        if (data[0] == ID_LowPriBulkData_NoTimestamp)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
            if (channel != kLowPriBulkData_Channel) {
                Logger.Error("Corrupted data: Wrong channel");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
            if (bytes != kLowPriBulkData_Bytes) {
                Logger.Error("Corrupted data: Wrong size");
            }
            uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
            if (magic != kLowPriBulkMagic) {
                Logger.Error("Corrupted data: Bad magic");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
            uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
            TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
            if (NextPacketIndex != packetIndex) {
                Logger.Error("Corrupted data: Incorrect packet id");
            }
            NextPacketIndex = packetIndex + 1;
            for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
                TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
            }

            return;
        }

        if (data[0] == ID_LowPriBulkData_HasTimestamp)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
            if (channel != kLowPriBulkData_Channel) {
                Logger.Error("Corrupted data: Wrong channel");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
            if (bytes != kLowPriBulkData_Bytes) {
                Logger.Error("Corrupted data: Wrong size");
            }
            uint16_t ts16 = tonk::ReadU16_LE(data + 1);
            uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
            uint64_t lo16 = FromLocalTime16(ts16);
            uint64_t lo23 = FromLocalTime23(ts23);
            uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
            if (magic != kLowPriBulkMagic) {
                Logger.Error("Corrupted data: Bad magic");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
            uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
            TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
            if (NextPacketIndex != packetIndex) {
                Logger.Error("Corrupted data: Incorrect packet id");
            }
            NextPacketIndex = packetIndex + 1;
            for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
                TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
            }

            if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
            {
                uint64_t nowUsec = tonk_time();
                uint64_t owdUsec = nowUsec - lo23;
                OWDStats.AddSample(owdUsec);

                if (nowUsec - LastStatsUsec >= kStatsReportIntervalUsec)
                {
                    LastStatsUsec = nowUsec;
#ifdef ENABLE_P2P_DATA_RESULT
                    Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                    OWDStats.PrintStatistics();
#endif
                }
            }

            return;
        }
    }

    Logger.Error("Peer: Got ", bytes, " bytes of message data");
    TONK_CPP_SDK_DEBUG_BREAK();
}